

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall
tlx::CmdlineParser::ArgumentUnsigned::process(ArgumentUnsigned *this,int *argc,char ***argv)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long x;
  char *endptr;
  char ***argv_local;
  int *argc_local;
  ArgumentUnsigned *this_local;
  
  if ((((*argc != 0) &&
       (endptr = (char *)argv, argv_local = (char ***)argc, argc_local = (int *)this,
       uVar2 = strtoul(**argv,(char **)&x,10), x != 0)) && (*(char *)x == '\0')) &&
     (uVar1 = std::numeric_limits<unsigned_int>::max(), uVar2 <= uVar1)) {
    *(int *)argv_local = *(int *)argv_local + -1;
    *(long *)endptr = *(long *)endptr + 8;
    *this->dest_ = (uint)uVar2;
    return true;
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        unsigned long x = strtoul(argv[0], &endptr, 10);
        if (endptr != nullptr && *endptr == 0 &&
            x <= std::numeric_limits<unsigned int>::max()) {
            --argc, ++argv;
            dest_ = static_cast<unsigned int>(x);
            return true;
        }
        else {
            return false;
        }
    }